

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall
mkvparser::AudioTrack::AudioTrack
          (AudioTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  Track::Track(&this->super_Track,pSegment,element_start,element_size);
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__Track_0054b4c8;
  return;
}

Assistant:

AudioTrack::AudioTrack(Segment* pSegment, long long element_start,
                       long long element_size)
    : Track(pSegment, element_start, element_size) {}